

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O0

void __thiscall re2::PrefilterTree::PrintPrefilter(PrefilterTree *this,int regexpid)

{
  ostream *poVar1;
  int in_ESI;
  long in_RDI;
  LogMessage *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  LogMessage *in_stack_fffffffffffffe70;
  Prefilter *in_stack_fffffffffffffef0;
  PrefilterTree *in_stack_fffffffffffffef8;
  
  LogMessage::LogMessage
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  poVar1 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffe70);
  std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
            ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)(in_RDI + 0x30),
             (long)in_ESI);
  DebugNodeString_abi_cxx11_(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator<<(poVar1,(string *)&stack0xfffffffffffffe40);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
  LogMessage::~LogMessage(in_stack_fffffffffffffe40);
  return;
}

Assistant:

void PrefilterTree::PrintPrefilter(int regexpid) {
  LOG(ERROR) << DebugNodeString(prefilter_vec_[regexpid]);
}